

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

double sexp_half_to_double(unsigned_short x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined6 in_register_0000003a;
  sexp_flonum_conv x_1;
  
  iVar4 = (int)CONCAT62(in_register_0000003a,x);
  if (iVar4 == 0x7c00) {
    return INFINITY;
  }
  if (iVar4 == 0xfc00) {
    return -INFINITY;
  }
  if (iVar4 != 0x7fff) {
    uVar5 = (uint)x << 0xd & 0x7fe000;
    uVar3 = x >> 10 & 0x1f;
    uVar2 = ((uint)(float)uVar5 & 0x7f800000) + 0xed800000 +
            (((uint)x << 0xd) << (0x96U - (char)((uint)(float)uVar5 >> 0x17) & 0x1f) & 0x7fe000);
    if (uVar5 == 0) {
      uVar2 = 0;
    }
    uVar1 = 0;
    uVar5 = uVar3 * 0x800000 + 0x38000000 + uVar5;
    if ((x >> 10 & 0x1f) == 0) {
      uVar1 = uVar2;
      uVar5 = uVar3;
    }
    return (double)(float)(uVar5 | (int)(short)x & 0x80000000U | uVar1);
  }
  return NAN;
}

Assistant:

double sexp_half_to_double(unsigned short x) {
  unsigned int e, m, v;
  if (x == 31744) return INFINITY;
  if (x == 32767) return NAN;
  if (x == 64512) return -INFINITY;
  e = (x&0x7C00)>>10;
  m = (x&0x03FF)<<13;
  v = float_as_int((float)m)>>23;
  return int_as_float((x&0x8000)<<16 | (e!=0)*((e+112)<<23|m) | ((e==0)&(m!=0))*((v-37)<<23|((m<<(150-v))&0x007FE000)));
}